

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O2

int __thiscall Fl_Tree_Item::find_child(Fl_Tree_Item *this,char *name)

{
  uint uVar1;
  Fl_Tree_Item **ppFVar2;
  char *__s1;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (name != (char *)0x0) {
    uVar1 = (this->_children)._total;
    ppFVar2 = (this->_children)._items;
    uVar5 = 0;
    uVar4 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar4 = uVar5;
    }
    for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      __s1 = ppFVar2[uVar5]->_label;
      if ((__s1 != (char *)0x0) && (iVar3 = strcmp(__s1,name), iVar3 == 0)) {
        return (int)uVar5;
      }
    }
  }
  return -1;
}

Assistant:

int Fl_Tree_Item::find_child(const char *name) {
  if ( name ) {
    for ( int t=0; t<children(); t++ )
      if ( child(t)->label() )
        if ( strcmp(child(t)->label(), name) == 0 )
          return(t);
  }
  return(-1);
}